

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_ht_7(void)

{
  _Bool _Var1;
  spki_record *psVar2;
  long in_FS_OFFSET;
  uint uVar3;
  uint asn;
  uint j_1;
  uint i_5;
  uint j;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint size_2;
  spki_record *result_2;
  uint size_1;
  spki_record *in_stack_ffffffffffceebe0;
  spki_record *result_1;
  uint size;
  spki_record *in_stack_ffffffffffceebf0;
  spki_record *result;
  spki_record *records_n_n [2000] [200];
  spki_record *records [2000];
  undefined1 local_180 [8];
  spki_table table;
  
  table.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  spki_table_init((spki_table *)local_180,(spki_update_fp)0x0);
  for (i_2 = 0; i_2 < 2000; i_2 = i_2 + 1) {
    psVar2 = create_record(0x9fb,i_2,i_2,(rtr_socket *)0x0);
    records[(ulong)i_2 - 1] = psVar2;
    _spki_table_add_assert((spki_table *)local_180,records[(ulong)i_2 - 1]);
  }
  i_3 = 0;
  while( true ) {
    if (1999 < i_3) {
      spki_table_free((spki_table *)local_180);
      spki_table_init((spki_table *)local_180,(spki_update_fp)0x0);
      for (i_4 = 0; i_4 < 2000; i_4 = i_4 + 1) {
        psVar2 = create_record(i_4,100,100,(rtr_socket *)0x0);
        records[(ulong)i_4 - 1] = psVar2;
        _spki_table_add_assert((spki_table *)local_180,records[(ulong)i_4 - 1]);
      }
      j = 0;
      while( true ) {
        if (1999 < j) {
          spki_table_free((spki_table *)local_180);
          spki_table_init((spki_table *)local_180,(spki_update_fp)0x0);
          for (i_5 = 0; i_5 < 2000; i_5 = i_5 + 1) {
            for (j_1 = 0; j_1 < 200; j_1 = j_1 + 1) {
              psVar2 = create_record(i_5,j_1,j_1,(rtr_socket *)0x0);
              records_n_n[(ulong)i_5 - 1][(ulong)j_1 + 199] = psVar2;
              _spki_table_add_assert
                        ((spki_table *)local_180,records_n_n[(ulong)i_5 - 1][(ulong)j_1 + 199]);
            }
          }
          asn = 0;
          do {
            if (1999 < asn) {
              spki_table_free((spki_table *)local_180);
              printf("%s() complete\n","test_ht_7");
              if (*(long *)(in_FS_OFFSET + 0x28) == table.lock._48_8_) {
                return;
              }
              __stack_chk_fail();
            }
            for (uVar3 = 0; uVar3 < 200; uVar3 = uVar3 + 1) {
              i_1 = 0;
              spki_table_get_all((spki_table *)local_180,asn,
                                 records_n_n[(ulong)asn - 1][(ulong)uVar3 + 199]->ski,
                                 (spki_record **)&i,&i_1);
              if (i_1 != 1) {
                __assert_fail("size == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                              ,0x1f8,"void test_ht_7(void)");
              }
              _Var1 = spki_records_are_equal(records_n_n[(ulong)asn - 1][(ulong)uVar3 + 199],_i);
              if (!_Var1) {
                __assert_fail("spki_records_are_equal(records_n_n[i][j], &result[0])",
                              "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                              ,0x1f9,"void test_ht_7(void)");
              }
              free(_i);
              free(records_n_n[(ulong)asn - 1][(ulong)uVar3 + 199]);
            }
            asn = asn + 1;
          } while( true );
        }
        result_2._4_4_ = 0;
        spki_table_get_all((spki_table *)local_180,j,records[0x7ce]->ski,
                           (spki_record **)&stack0xffffffffffceebe0,(uint *)((long)&result_2 + 4));
        if (result_2._4_4_ != 1) {
          __assert_fail("size == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0x1dd,"void test_ht_7(void)");
        }
        _Var1 = spki_records_are_equal(records[(ulong)j - 1],in_stack_ffffffffffceebe0);
        if (!_Var1) break;
        free(in_stack_ffffffffffceebe0);
        free(records[(ulong)j - 1]);
        j = j + 1;
      }
      __assert_fail("spki_records_are_equal(records[i], &result[0])",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x1de,"void test_ht_7(void)");
    }
    result_1._4_4_ = 0;
    spki_table_get_all((spki_table *)local_180,0x9fb,records[(ulong)i_3 - 1]->ski,
                       (spki_record **)&stack0xffffffffffceebf0,(uint *)((long)&result_1 + 4));
    if (result_1._4_4_ != 1) {
      __assert_fail("size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x1c7,"void test_ht_7(void)");
    }
    _Var1 = spki_records_are_equal(records[(ulong)i_3 - 1],in_stack_ffffffffffceebf0);
    if (!_Var1) break;
    free(in_stack_ffffffffffceebf0);
    free(records[(ulong)i_3 - 1]);
    i_3 = i_3 + 1;
  }
  __assert_fail("spki_records_are_equal(records[i], &result[0])",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0x1c8,"void test_ht_7(void)");
}

Assistant:

static void test_ht_7(void)
{
	struct spki_table table;
	struct spki_record *records[NUM_OF_RECORDS];
	/* ASN(1) <---> SKI(n) ---------------------------------------------- */
	spki_table_init(&table, NULL);
	/* Create NUM_OF_RECORDS spki_records with same ASN but different SKI */
	for (unsigned int i = 0; i < NUM_OF_RECORDS; i++) {
		records[i] = create_record(2555, i, i, NULL);
		_spki_table_add_assert(&table, records[i]);
	}

	/* Validate */
	for (unsigned int i = 0; i < NUM_OF_RECORDS; i++) {
		struct spki_record *result;
		unsigned int size = 0;

		spki_table_get_all(&table, 2555, records[i]->ski, &result, &size);

		assert(size == 1);
		assert(spki_records_are_equal(records[i], &result[0]));
		free(result);
		free(records[i]);
	}
	spki_table_free(&table);

	/* ASN(n) <---> SKI(1) ---------------------------------------------- */
	spki_table_init(&table, NULL);
	/* Create NUM_OF_RECORDS spki_records with same SKI but different ASN */
	for (unsigned int i = 0; i < NUM_OF_RECORDS; i++) {
		records[i] = create_record(i, 100, 100, NULL);
		_spki_table_add_assert(&table, records[i]);
	}

	/* Validate */
	for (unsigned int i = 0; i < NUM_OF_RECORDS; i++) {
		struct spki_record *result;
		unsigned int size = 0;

		spki_table_get_all(&table, i, records[NUM_OF_RECORDS - 1]->ski, &result, &size);

		assert(size == 1);
		assert(spki_records_are_equal(records[i], &result[0]));
		free(result);
		free(records[i]);
	}
	spki_table_free(&table);

	struct spki_record *records_n_n[NUM_OF_RECORDS][NUM_OF_SKI];
	/* ASN(n) <---> SKI(n) ---------------------------------------------- */
	spki_table_init(&table, NULL);
	/* Create: {NUM_OF_RECORDS} x {NUM_OF_SKI} spki_records */
	/* {ASN_0,ASN_1...} x {SKI_0, SKI_1...} */
	for (unsigned int i = 0; i < NUM_OF_RECORDS; i++) {
		for (unsigned int j = 0; j < NUM_OF_SKI; j++) {
			records_n_n[i][j] = create_record(i, j, j, NULL);
			_spki_table_add_assert(&table, records_n_n[i][j]);
		}
	}

	/* Validate */
	for (unsigned int i = 0; i < NUM_OF_RECORDS; i++) {
		for (unsigned int j = 0; j < NUM_OF_SKI; j++) {
			struct spki_record *result;
			unsigned int size = 0;

			spki_table_get_all(&table, i, records_n_n[i][j]->ski, &result, &size);

			assert(size == 1);
			assert(spki_records_are_equal(records_n_n[i][j], &result[0]));
			free(result);
			free(records_n_n[i][j]);
		}
	}

	/* cleanup: free memory */
	spki_table_free(&table);
	printf("%s() complete\n", __func__);
}